

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

void __thiscall flow::lang::Parser::importRuntime(Parser *this)

{
  Runtime *pRVar1;
  pointer puVar2;
  pointer puVar3;
  
  pRVar1 = this->runtime_;
  if (pRVar1 != (Runtime *)0x0) {
    puVar2 = (pRVar1->builtins_).
             super__Vector_base<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (pRVar1->builtins_).
                  super__Vector_base<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1)
    {
      declareBuiltin(this,(puVar3->_M_t).
                          super___uniq_ptr_impl<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>
                          .super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl);
    }
  }
  return;
}

Assistant:

void Parser::importRuntime() {
  if (runtime_) {
    for (const auto& builtin : runtime_->builtins()) {
      declareBuiltin(builtin);
    }
  }
}